

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_23::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
          (DescriptorsByNameEq<google::protobuf::Descriptor> *this,Descriptor *lhs,Descriptor *rhs)

{
  DescriptorStringView __lhs;
  DescriptorStringView __rhs;
  undefined1 local_21;
  Descriptor *rhs_local;
  Descriptor *lhs_local;
  DescriptorsByNameEq<google::protobuf::Descriptor> *this_local;
  
  local_21 = true;
  if (lhs != rhs) {
    __lhs = Descriptor::name_abi_cxx11_(lhs);
    __rhs = Descriptor::name_abi_cxx11_(rhs);
    local_21 = std::operator==(__lhs,__rhs);
  }
  return local_21;
}

Assistant:

bool operator()(const DescriptorT* lhs, const DescriptorT* rhs) const {
    return lhs == rhs || lhs->name() == rhs->name();
  }